

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_util.cpp
# Opt level: O0

void spirv_cross_util::inherit_combined_sampler_bindings(Compiler *compiler)

{
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *pSVar1;
  bool bVar2;
  ID local_58;
  ID local_54;
  uint32_t local_50;
  ID local_4c;
  uint32_t binding;
  ID local_44;
  uint32_t local_40;
  ID local_3c;
  uint32_t set;
  CombinedImageSampler *s;
  CombinedImageSampler *__end1;
  CombinedImageSampler *__begin1;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *__range1;
  SmallVector<spirv_cross::CombinedImageSampler,_8UL> *samplers;
  Compiler *compiler_local;
  
  samplers = (SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)compiler;
  __begin1 = (CombinedImageSampler *)spirv_cross::Compiler::get_combined_image_samplers(compiler);
  __range1 = (SmallVector<spirv_cross::CombinedImageSampler,_8UL> *)__begin1;
  __end1 = spirv_cross::VectorView<spirv_cross::CombinedImageSampler>::begin
                     ((VectorView<spirv_cross::CombinedImageSampler> *)__begin1);
  s = spirv_cross::VectorView<spirv_cross::CombinedImageSampler>::end
                ((VectorView<spirv_cross::CombinedImageSampler> *)__begin1);
  for (; pSVar1 = samplers, __end1 != s; __end1 = __end1 + 1) {
    _set = __end1;
    spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
              (&local_3c,&__end1->image_id);
    bVar2 = spirv_cross::Compiler::has_decoration
                      ((Compiler *)pSVar1,local_3c,DecorationDescriptorSet);
    pSVar1 = samplers;
    if (bVar2) {
      spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                (&local_44,&_set->image_id);
      local_40 = spirv_cross::Compiler::get_decoration
                           ((Compiler *)pSVar1,local_44,DecorationDescriptorSet);
      pSVar1 = samplers;
      spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                ((TypedID<(spirv_cross::Types)0> *)&binding,&_set->combined_id);
      spirv_cross::Compiler::set_decoration
                ((Compiler *)pSVar1,(ID)binding,DecorationDescriptorSet,local_40);
    }
    pSVar1 = samplers;
    spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
              (&local_4c,&_set->image_id);
    bVar2 = spirv_cross::Compiler::has_decoration((Compiler *)pSVar1,local_4c,DecorationBinding);
    pSVar1 = samplers;
    if (bVar2) {
      spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                (&local_54,&_set->image_id);
      local_50 = spirv_cross::Compiler::get_decoration
                           ((Compiler *)pSVar1,local_54,DecorationBinding);
      pSVar1 = samplers;
      spirv_cross::TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                (&local_58,&_set->combined_id);
      spirv_cross::Compiler::set_decoration((Compiler *)pSVar1,local_58,DecorationBinding,local_50);
    }
  }
  return;
}

Assistant:

void inherit_combined_sampler_bindings(Compiler &compiler)
{
	auto &samplers = compiler.get_combined_image_samplers();
	for (auto &s : samplers)
	{
		if (compiler.has_decoration(s.image_id, spv::DecorationDescriptorSet))
		{
			uint32_t set = compiler.get_decoration(s.image_id, spv::DecorationDescriptorSet);
			compiler.set_decoration(s.combined_id, spv::DecorationDescriptorSet, set);
		}

		if (compiler.has_decoration(s.image_id, spv::DecorationBinding))
		{
			uint32_t binding = compiler.get_decoration(s.image_id, spv::DecorationBinding);
			compiler.set_decoration(s.combined_id, spv::DecorationBinding, binding);
		}
	}
}